

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Functional::ShaderDataSpec::ShaderDataSpec(ShaderDataSpec *this)

{
  ShaderValue *local_18;
  ShaderDataSpec *this_local;
  
  FloatScalar::FloatScalar(&this->resultScale,1.0);
  FloatScalar::FloatScalar(&this->resultBias,0.0);
  FloatScalar::FloatScalar(&this->referenceScale,1.0);
  FloatScalar::FloatScalar(&this->referenceBias,0.0);
  this->precision = PRECISION_LAST;
  this->output = TYPE_LAST;
  this->numInputs = 0;
  local_18 = this->inputs;
  do {
    ShaderValue::ShaderValue(local_18);
    local_18 = local_18 + 1;
  } while ((ShaderDataSpec *)local_18 != this + 1);
  return;
}

Assistant:

ShaderDataSpec (void)
		: resultScale		(1.0f)
		, resultBias		(0.0f)
		, referenceScale	(1.0f)
		, referenceBias		(0.0f)
		, precision			(PRECISION_LAST)
		, output			(TYPE_LAST)
		, numInputs			(0)
	{
	}